

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall
mkvparser::Segment::DoParseNext(Segment *this,Cluster **pResult,longlong *pos,long *len)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  longlong lVar4;
  longlong lVar5;
  long lVar6;
  long lVar7;
  Segment *this_00;
  long *in_RCX;
  long lVar8;
  long *in_RDX;
  undefined8 *in_RSI;
  Segment *in_RDI;
  longlong unknown_size_1;
  longlong size_1;
  longlong id_1;
  longlong idpos_1;
  longlong result_1;
  longlong payload_pos;
  ptrdiff_t idx_next;
  Cluster *pNext_1;
  long len_;
  longlong pos_;
  Cluster *pNext;
  Cluster **k;
  Cluster **j;
  Cluster **jj;
  Cluster **i;
  Cluster **ii;
  longlong element_size;
  longlong element_start;
  longlong element_stop;
  longlong unknown_size;
  longlong size;
  longlong id;
  longlong idoff;
  longlong idpos;
  longlong result;
  longlong cluster_size;
  longlong off_next;
  longlong segment_stop;
  long status;
  longlong avail;
  longlong total;
  Segment *in_stack_fffffffffffffe98;
  Cues *in_stack_fffffffffffffea0;
  Cues *in_stack_fffffffffffffea8;
  long lVar9;
  long pos_00;
  Cluster *in_stack_fffffffffffffec0;
  Cluster *in_stack_fffffffffffffec8;
  long in_stack_fffffffffffffed0;
  Segment *in_stack_fffffffffffffed8;
  ptrdiff_t in_stack_fffffffffffffee8;
  long *in_stack_ffffffffffffff00;
  longlong *in_stack_ffffffffffffff08;
  Cluster *in_stack_ffffffffffffff10;
  Segment *in_stack_ffffffffffffff18;
  Segment *local_e0;
  Segment *local_d0;
  long local_58;
  long local_38;
  long local_30;
  long *local_28;
  long *local_20;
  undefined8 *local_18;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  iVar3 = (*in_RDI->m_pReader->_vptr_IMkvReader[1])(in_RDI->m_pReader,&local_30,&local_38);
  if ((long)iVar3 < 0) {
    return (long)iVar3;
  }
  if (in_RDI->m_size < 0) {
    lVar9 = -1;
  }
  else {
    lVar9 = in_RDI->m_start + in_RDI->m_size;
  }
  local_58 = -1;
  pos_00 = lVar9;
  while( true ) {
    while( true ) {
      do {
        if ((-1 < local_30) && (local_30 <= *local_20)) {
          return 1;
        }
        if ((-1 < lVar9) && (lVar9 <= *local_20)) {
          return 1;
        }
        if (local_38 < *local_20 + 1) {
          *local_28 = 1;
          return -3;
        }
        lVar4 = GetUIntLength((IMkvReader *)in_stack_fffffffffffffea8,
                              (longlong)in_stack_fffffffffffffea0,(long *)in_stack_fffffffffffffe98)
        ;
        if (lVar4 < 0) {
          return lVar4;
        }
        if (0 < lVar4) {
          return -3;
        }
        if ((-1 < lVar9) && (lVar9 < *local_20 + *local_28)) {
          return -2;
        }
        if (local_38 < *local_20 + *local_28) {
          return -3;
        }
        lVar7 = *local_20;
        lVar8 = *local_20 - in_RDI->m_start;
        lVar4 = ReadID((IMkvReader *)in_stack_fffffffffffffec8,(longlong)in_stack_fffffffffffffec0,
                       (long *)in_RDI);
        if (lVar4 < 0) {
          return lVar4;
        }
        if (lVar4 == 0) {
          return -1;
        }
        *local_20 = *local_28 + *local_20;
        if (local_38 < *local_20 + 1) {
          *local_28 = 1;
          return -3;
        }
        lVar5 = GetUIntLength((IMkvReader *)in_stack_fffffffffffffea8,
                              (longlong)in_stack_fffffffffffffea0,(long *)in_stack_fffffffffffffe98)
        ;
        if (lVar5 < 0) {
          return lVar5;
        }
        if (0 < lVar5) {
          return -3;
        }
        if ((-1 < lVar9) && (lVar9 < *local_20 + *local_28)) {
          return -2;
        }
        if (local_38 < *local_20 + *local_28) {
          return -3;
        }
        lVar5 = ReadUInt((IMkvReader *)in_RDI,pos_00,(long *)in_stack_fffffffffffffea8);
        if (lVar5 < 0) {
          return lVar5;
        }
        *local_20 = *local_28 + *local_20;
      } while (lVar5 == 0);
      lVar6 = (1L << ((char)*local_28 * '\a' & 0x3fU)) + -1;
      if (((-1 < lVar9) && (lVar5 != lVar6)) && (lVar9 < lVar5 + *local_20)) {
        return -2;
      }
      if (lVar4 != 0x1c53bb6b) break;
      if (lVar5 == lVar6) {
        return -2;
      }
      lVar8 = *local_20;
      if ((-1 < lVar9) && (lVar9 < lVar5 + lVar8)) {
        return -2;
      }
      if (in_RDI->m_pCues == (Cues *)0x0) {
        in_stack_fffffffffffffea0 = (Cues *)operator_new(0x48,(nothrow_t *)&std::nothrow);
        in_stack_fffffffffffffea8 = (Cues *)0x0;
        if (in_stack_fffffffffffffea0 != (Cues *)0x0) {
          Cues::Cues(in_stack_fffffffffffffea0,in_RDI,*local_20,lVar5,lVar7,(lVar5 + lVar8) - lVar7)
          ;
          in_stack_fffffffffffffea8 = in_stack_fffffffffffffea0;
        }
        in_RDI->m_pCues = in_stack_fffffffffffffea8;
        if (in_RDI->m_pCues == (Cues *)0x0) {
          return 0;
        }
      }
      *local_20 = lVar5 + *local_20;
      if ((-1 < lVar9) && (lVar9 < *local_20)) {
        return -2;
      }
    }
    if (lVar4 == 0x1f43b675) break;
    if (lVar5 == lVar6) {
      return -2;
    }
    *local_20 = lVar5 + *local_20;
    if ((-1 < lVar9) && (lVar9 < *local_20)) {
      return -2;
    }
  }
  if (lVar5 != lVar6) {
    local_58 = lVar5;
  }
  local_d0 = (Segment *)(in_RDI->m_clusters + in_RDI->m_clusterCount);
  local_e0 = (Segment *)(&local_d0->m_pReader + in_RDI->m_clusterPreloadCount);
  while (local_d0 < local_e0) {
    auVar1._8_8_ = (long)local_e0 - (long)local_d0 >> 0x3f;
    auVar1._0_8_ = (long)local_e0 - (long)local_d0 >> 3;
    in_stack_ffffffffffffff18 = (Segment *)(&local_d0->m_pReader + SUB168(auVar1 / SEXT816(2),0));
    in_stack_ffffffffffffff10 = (Cluster *)in_stack_ffffffffffffff18->m_pReader;
    in_stack_fffffffffffffe98 = local_d0;
    lVar4 = Cluster::GetPosition(in_stack_ffffffffffffff10);
    *local_20 = lVar4;
    if (*local_20 < lVar8) {
      local_d0 = (Segment *)&in_stack_ffffffffffffff18->m_element_start;
    }
    else {
      local_e0 = in_stack_ffffffffffffff18;
      if (*local_20 <= lVar8) {
        *local_18 = in_stack_ffffffffffffff10;
        return 0;
      }
    }
  }
  lVar7 = Cluster::HasBlockEntries
                    (in_stack_ffffffffffffff18,(longlong)in_stack_ffffffffffffff10,
                     in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  if (lVar7 < 0) {
    *local_20 = (long)in_stack_ffffffffffffff08;
    *local_28 = (long)in_stack_ffffffffffffff00;
    return lVar7;
  }
  if (0 < lVar7) {
    this_00 = (Segment *)
              Cluster::Create(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                              (longlong)in_stack_fffffffffffffec8);
    if (this_00 == (Segment *)0x0) {
      return -1;
    }
    bVar2 = PreloadCluster(this_00,(Cluster *)((long)local_d0 - (long)in_RDI->m_clusters >> 3),
                           in_stack_fffffffffffffee8);
    if (!bVar2) {
      if (this_00 != (Segment *)0x0) {
        Cluster::~Cluster(in_stack_fffffffffffffec0);
        operator_delete(this_00);
      }
      return -1;
    }
    *local_18 = this_00;
    return 0;
  }
  if (local_58 < 0) {
    lVar7 = *local_20;
    while (((local_30 < 0 || (*local_20 < local_30)) && ((lVar9 < 0 || (*local_20 < lVar9))))) {
      if (local_38 < *local_20 + 1) {
        *local_28 = 1;
        return -3;
      }
      lVar4 = GetUIntLength((IMkvReader *)in_stack_fffffffffffffea8,
                            (longlong)in_stack_fffffffffffffea0,(long *)in_stack_fffffffffffffe98);
      if (lVar4 < 0) {
        return lVar4;
      }
      if (0 < lVar4) {
        return -3;
      }
      if ((-1 < lVar9) && (lVar9 < *local_20 + *local_28)) {
        return -2;
      }
      if (local_38 < *local_20 + *local_28) {
        return -3;
      }
      lVar4 = ReadID((IMkvReader *)in_stack_fffffffffffffec8,(longlong)in_stack_fffffffffffffec0,
                     (long *)in_RDI);
      if (lVar4 < 0) {
        return lVar4;
      }
      if ((lVar4 == 0x1f43b675) || (lVar4 == 0x1c53bb6b)) break;
      *local_20 = *local_28 + *local_20;
      if (local_38 < *local_20 + 1) {
        *local_28 = 1;
        return -3;
      }
      lVar4 = GetUIntLength((IMkvReader *)in_stack_fffffffffffffea8,
                            (longlong)in_stack_fffffffffffffea0,(long *)in_stack_fffffffffffffe98);
      if (lVar4 < 0) {
        return lVar4;
      }
      if (0 < lVar4) {
        return -3;
      }
      if ((-1 < lVar9) && (lVar9 < *local_20 + *local_28)) {
        return -2;
      }
      if (local_38 < *local_20 + *local_28) {
        return -3;
      }
      in_stack_fffffffffffffec8 =
           (Cluster *)ReadUInt((IMkvReader *)in_RDI,pos_00,(long *)in_stack_fffffffffffffea8);
      if ((long)in_stack_fffffffffffffec8 < 0) {
        return (long)in_stack_fffffffffffffec8;
      }
      *local_20 = *local_28 + *local_20;
      if (in_stack_fffffffffffffec8 != (Cluster *)0x0) {
        in_stack_fffffffffffffec0 = (Cluster *)((1L << ((char)*local_28 * '\a' & 0x3fU)) + -1);
        if (in_stack_fffffffffffffec8 == in_stack_fffffffffffffec0) {
          return -2;
        }
        if ((-1 < lVar9) && (lVar9 < (long)&in_stack_fffffffffffffec8->m_pSegment + *local_20)) {
          return -2;
        }
        *local_20 = (long)&in_stack_fffffffffffffec8->m_pSegment + *local_20;
        if ((-1 < lVar9) && (lVar9 < *local_20)) {
          return -2;
        }
      }
    }
    local_58 = *local_20 - lVar7;
    *local_20 = lVar7;
  }
  *local_20 = local_58 + *local_20;
  if ((-1 < lVar9) && (lVar9 < *local_20)) {
    return -2;
  }
  return 2;
}

Assistant:

long Segment::DoParseNext(const Cluster*& pResult, long long& pos, long& len) {
  long long total, avail;

  long status = m_pReader->Length(&total, &avail);

  if (status < 0)  // error
    return status;

  assert((total < 0) || (avail <= total));

  const long long segment_stop = (m_size < 0) ? -1 : m_start + m_size;

  // Parse next cluster.  This is strictly a parsing activity.
  // Creation of a new cluster object happens later, after the
  // parsing is done.

  long long off_next = 0;
  long long cluster_size = -1;

  for (;;) {
    if ((total >= 0) && (pos >= total))
      return 1;  // EOF

    if ((segment_stop >= 0) && (pos >= segment_stop))
      return 1;  // EOF

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    long long result = GetUIntLength(m_pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)  // weird
      return E_BUFFER_NOT_FULL;

    if ((segment_stop >= 0) && ((pos + len) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long idpos = pos;  // absolute
    const long long idoff = pos - m_start;  // relative

    const long long id = ReadID(m_pReader, idpos, len);  // absolute

    if (id < 0)  // error
      return static_cast<long>(id);

    if (id == 0)  // weird
      return -1;  // generic error

    pos += len;  // consume ID

    // Read Size

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    result = GetUIntLength(m_pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)  // weird
      return E_BUFFER_NOT_FULL;

    if ((segment_stop >= 0) && ((pos + len) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long size = ReadUInt(m_pReader, pos, len);

    if (size < 0)  // error
      return static_cast<long>(size);

    pos += len;  // consume length of size of element

    // Pos now points to start of payload

    if (size == 0)  // weird
      continue;

    const long long unknown_size = (1LL << (7 * len)) - 1;

    if ((segment_stop >= 0) && (size != unknown_size) &&
        ((pos + size) > segment_stop)) {
      return E_FILE_FORMAT_INVALID;
    }

    if (id == libwebm::kMkvCues) {
      if (size == unknown_size)
        return E_FILE_FORMAT_INVALID;

      const long long element_stop = pos + size;

      if ((segment_stop >= 0) && (element_stop > segment_stop))
        return E_FILE_FORMAT_INVALID;

      const long long element_start = idpos;
      const long long element_size = element_stop - element_start;

      if (m_pCues == NULL) {
        m_pCues = new (std::nothrow)
            Cues(this, pos, size, element_start, element_size);
        if (m_pCues == NULL)
          return false;
      }

      pos += size;  // consume payload
      if (segment_stop >= 0 && pos > segment_stop)
        return E_FILE_FORMAT_INVALID;

      continue;
    }

    if (id != libwebm::kMkvCluster) {  // not a Cluster ID
      if (size == unknown_size)
        return E_FILE_FORMAT_INVALID;

      pos += size;  // consume payload
      if (segment_stop >= 0 && pos > segment_stop)
        return E_FILE_FORMAT_INVALID;

      continue;
    }

    // We have a cluster.
    off_next = idoff;

    if (size != unknown_size)
      cluster_size = size;

    break;
  }

  assert(off_next > 0);  // have cluster

  // We have parsed the next cluster.
  // We have not created a cluster object yet.  What we need
  // to do now is determine whether it has already be preloaded
  //(in which case, an object for this cluster has already been
  // created), and if not, create a new cluster object.

  Cluster** const ii = m_clusters + m_clusterCount;
  Cluster** i = ii;

  Cluster** const jj = ii + m_clusterPreloadCount;
  Cluster** j = jj;

  while (i < j) {
    // INVARIANT:
    //[0, i) < pos_next
    //[i, j) ?
    //[j, jj)  > pos_next

    Cluster** const k = i + (j - i) / 2;
    assert(k < jj);

    const Cluster* const pNext = *k;
    assert(pNext);
    assert(pNext->m_index < 0);

    pos = pNext->GetPosition();
    assert(pos >= 0);

    if (pos < off_next)
      i = k + 1;
    else if (pos > off_next)
      j = k;
    else {
      pResult = pNext;
      return 0;  // success
    }
  }

  assert(i == j);

  long long pos_;
  long len_;

  status = Cluster::HasBlockEntries(this, off_next, pos_, len_);

  if (status < 0) {  // error or underflow
    pos = pos_;
    len = len_;

    return status;
  }

  if (status > 0) {  // means "found at least one block entry"
    Cluster* const pNext = Cluster::Create(this,
                                           -1,  // preloaded
                                           off_next);
    if (pNext == NULL)
      return -1;

    const ptrdiff_t idx_next = i - m_clusters;  // insertion position

    if (!PreloadCluster(pNext, idx_next)) {
      delete pNext;
      return -1;
    }
    assert(m_clusters);
    assert(idx_next < m_clusterSize);
    assert(m_clusters[idx_next] == pNext);

    pResult = pNext;
    return 0;  // success
  }

  // status == 0 means "no block entries found"

  if (cluster_size < 0) {  // unknown size
    const long long payload_pos = pos;  // absolute pos of cluster payload

    for (;;) {  // determine cluster size
      if ((total >= 0) && (pos >= total))
        break;

      if ((segment_stop >= 0) && (pos >= segment_stop))
        break;  // no more clusters

      // Read ID

      if ((pos + 1) > avail) {
        len = 1;
        return E_BUFFER_NOT_FULL;
      }

      long long result = GetUIntLength(m_pReader, pos, len);

      if (result < 0)  // error
        return static_cast<long>(result);

      if (result > 0)  // weird
        return E_BUFFER_NOT_FULL;

      if ((segment_stop >= 0) && ((pos + len) > segment_stop))
        return E_FILE_FORMAT_INVALID;

      if ((pos + len) > avail)
        return E_BUFFER_NOT_FULL;

      const long long idpos = pos;
      const long long id = ReadID(m_pReader, idpos, len);

      if (id < 0)  // error (or underflow)
        return static_cast<long>(id);

      // This is the distinguished set of ID's we use to determine
      // that we have exhausted the sub-element's inside the cluster
      // whose ID we parsed earlier.

      if (id == libwebm::kMkvCluster || id == libwebm::kMkvCues)
        break;

      pos += len;  // consume ID (of sub-element)

      // Read Size

      if ((pos + 1) > avail) {
        len = 1;
        return E_BUFFER_NOT_FULL;
      }

      result = GetUIntLength(m_pReader, pos, len);

      if (result < 0)  // error
        return static_cast<long>(result);

      if (result > 0)  // weird
        return E_BUFFER_NOT_FULL;

      if ((segment_stop >= 0) && ((pos + len) > segment_stop))
        return E_FILE_FORMAT_INVALID;

      if ((pos + len) > avail)
        return E_BUFFER_NOT_FULL;

      const long long size = ReadUInt(m_pReader, pos, len);

      if (size < 0)  // error
        return static_cast<long>(size);

      pos += len;  // consume size field of element

      // pos now points to start of sub-element's payload

      if (size == 0)  // weird
        continue;

      const long long unknown_size = (1LL << (7 * len)) - 1;

      if (size == unknown_size)
        return E_FILE_FORMAT_INVALID;  // not allowed for sub-elements

      if ((segment_stop >= 0) && ((pos + size) > segment_stop))  // weird
        return E_FILE_FORMAT_INVALID;

      pos += size;  // consume payload of sub-element
      if (segment_stop >= 0 && pos > segment_stop)
        return E_FILE_FORMAT_INVALID;
    }  // determine cluster size

    cluster_size = pos - payload_pos;
    assert(cluster_size >= 0);  // TODO: handle cluster_size = 0

    pos = payload_pos;  // reset and re-parse original cluster
  }

  pos += cluster_size;  // consume payload
  if (segment_stop >= 0 && pos > segment_stop)
    return E_FILE_FORMAT_INVALID;

  return 2;  // try to find a cluster that follows next
}